

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  bool infoOnly;
  bool bVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  char *__end;
  string *psVar7;
  string l;
  string k;
  string j;
  string i;
  string directory;
  Bounds lBounds;
  Bounds kBounds;
  Bounds jBounds;
  Bounds iBounds;
  string basename;
  string savepointId;
  string filepath;
  string field;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc < 2) {
    printHelp();
    iVar4 = 0;
  }
  else {
    i._M_dataplus._M_p = (pointer)&i.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&i,":","");
    j._M_dataplus._M_p = (pointer)&j.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&j,":","");
    k._M_dataplus._M_p = (pointer)&k.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&k,":","");
    l._M_dataplus._M_p = (pointer)&l.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&l,":","");
    infoOnly = false;
switchD_001155fd_caseD_6d:
    do {
      iVar4 = getopt(argc,argv,"i:j:k:l:q:h");
      pcVar2 = _optarg;
      if (iVar4 - 0x68U < 10) {
        psVar7 = &j;
        switch(iVar4) {
        case 0x68:
          iVar4 = 0;
          printHelp();
          goto LAB_00115a85;
        case 0x69:
          psVar7 = &i;
          break;
        case 0x6a:
          break;
        case 0x6b:
          psVar7 = &k;
          break;
        case 0x6c:
          psVar7 = &l;
          break;
        default:
          goto switchD_001155fd_caseD_6d;
        case 0x71:
          infoOnly = true;
          goto switchD_001155fd_caseD_6d;
        }
        pcVar1 = (char *)psVar7->_M_string_length;
        strlen(_optarg);
        std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar1,(ulong)pcVar2);
        goto switchD_001155fd_caseD_6d;
      }
    } while (iVar4 != -1);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,i._M_dataplus._M_p,i._M_dataplus._M_p + i._M_string_length);
    iBounds = string2bounds(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,j._M_dataplus._M_p,j._M_dataplus._M_p + j._M_string_length);
    jBounds = string2bounds(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,k._M_dataplus._M_p,k._M_dataplus._M_p + k._M_string_length);
    kBounds = string2bounds(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,l._M_dataplus._M_p,l._M_dataplus._M_p + l._M_string_length);
    lBounds = string2bounds(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    lVar5 = (long)_optind;
    _optind = _optind + 1;
    std::__cxx11::string::string((string *)&filepath,argv[lVar5],(allocator *)&savepointId);
    lVar5 = (long)_optind;
    _optind = _optind + 1;
    std::__cxx11::string::string((string *)&savepointId,argv[lVar5],(allocator *)&directory);
    directory._M_string_length = 0;
    directory.field_2._M_local_buf[0] = '\0';
    basename._M_string_length = 0;
    basename.field_2._M_local_buf[0] = '\0';
    field._M_string_length = 0;
    field.field_2._M_local_buf[0] = '\0';
    directory._M_dataplus._M_p = (pointer)&directory.field_2;
    basename._M_dataplus._M_p = (pointer)&basename.field_2;
    field._M_dataplus._M_p = (pointer)&field.field_2;
    bVar3 = splitFilePath(&filepath,&directory,&basename,&field);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Directory: ",0xb);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,directory._M_dataplus._M_p,
                          directory._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Basename: ",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,basename._M_dataplus._M_p,basename._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SavepointId: ",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,savepointId._M_dataplus._M_p,
                          savepointId._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar4 = dump(&directory,&basename,&field,&savepointId,&iBounds,&jBounds,&kBounds,&lBounds,
                   infoOnly);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Invalid file: ",0xe)
      ;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,filepath._M_dataplus._M_p,filepath._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      iVar4 = 2;
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)field._M_dataplus._M_p != &field.field_2) {
      operator_delete(field._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)basename._M_dataplus._M_p != &basename.field_2) {
      operator_delete(basename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)directory._M_dataplus._M_p != &directory.field_2) {
      operator_delete(directory._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)savepointId._M_dataplus._M_p != &savepointId.field_2) {
      operator_delete(savepointId._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filepath._M_dataplus._M_p != &filepath.field_2) {
      operator_delete(filepath._M_dataplus._M_p);
    }
LAB_00115a85:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)l._M_dataplus._M_p != &l.field_2) {
      operator_delete(l._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)k._M_dataplus._M_p != &k.field_2) {
      operator_delete(k._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)j._M_dataplus._M_p != &j.field_2) {
      operator_delete(j._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)i._M_dataplus._M_p != &i.field_2) {
      operator_delete(i._M_dataplus._M_p);
    }
  }
  return iVar4;
}

Assistant:

int main (int argc, char **argv) {

	if (argc < 2)
	{
		printHelp();
		return 0;
	}

	int opt;
	std::string i = ":";
	std::string j = ":";
	std::string k = ":";
	std::string l = ":";
	bool infoOnly = false;
	while ( (opt = getopt(argc, argv, "i:j:k:l:q:h")) != -1) {
		switch (opt)
		{
		case 'i':
			i = optarg;
			break;
		case 'j':
			j = optarg;
			break;
		case 'k':
			k = optarg;
			break;
		case 'l':
			l = optarg;
			break;
		case 'q':
			infoOnly = true;
			break;
		case 'h':
			printHelp();
			return 0;
		}
	}

	Bounds iBounds = string2bounds(i);
	Bounds jBounds = string2bounds(j);
	Bounds kBounds = string2bounds(k);
	Bounds lBounds = string2bounds(l);

	std::string filepath = argv[optind++];
	std::string savepointId = argv[optind++];

	std::string directory;
	std::string basename;
	std::string field;
	if (!splitFilePath(filepath, directory, basename, field))
	{
		std::cerr << "Invalid file: " << filepath << std::endl;
		return 2;
	}

	std::cout << "Directory: " << directory << std::endl;
	std::cout << "Basename: " << basename << std::endl;
	std::cout << "SavepointId: " << savepointId << std::endl;

	return dump(directory, basename, field, savepointId,
	            iBounds, jBounds, kBounds, lBounds, infoOnly);
}